

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_layer.c
# Opt level: O0

REF_STATUS ref_layer_puff(REF_LAYER ref_layer,REF_GRID ref_grid)

{
  int iVar1;
  REF_INT cell_00;
  int node0_00;
  REF_CELL ref_cell_00;
  REF_NODE ref_node;
  REF_CELL ref_cell_01;
  REF_CELL ref_cell_02;
  uint uVar2;
  REF_INT local_290;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_LONG ref_private_status_reis_bi_2;
  REF_LONG ref_private_status_reis_ai_2;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  int local_228;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_INT edge_nodes [27];
  int local_1b4;
  int local_1b0;
  REF_BOOL contains1;
  REF_BOOL contains0;
  REF_INT cell_list [2];
  REF_INT ncell;
  REF_INT node1;
  REF_INT node0;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL norm [3];
  REF_GLOB global;
  int local_148;
  REF_INT nnode_per_layer;
  REF_INT i;
  REF_INT local;
  REF_INT node;
  REF_INT new_cell;
  REF_INT prism [27];
  REF_INT nodes [27];
  int local_50;
  int local_4c;
  REF_INT cell_edge;
  REF_INT cell_node;
  REF_INT cell;
  REF_INT item;
  REF_CELL layer_edge;
  REF_CELL layer_prism;
  REF_NODE layer_node;
  REF_CELL ref_cell;
  REF_GRID ref_grid_local;
  REF_LAYER ref_layer_local;
  
  ref_cell_00 = ref_grid->cell[3];
  ref_node = ref_layer->ref_grid->node;
  ref_cell_01 = ref_layer->ref_grid->cell[10];
  ref_cell_02 = ref_layer->ref_grid->cell[0];
  for (cell_node = 0; cell_node < ref_layer->ref_list->n; cell_node = cell_node + 1) {
    uVar2 = ref_cell_nodes(ref_cell_00,ref_layer->ref_list->value[cell_node],prism + 0x1a);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",0x85,
             "ref_layer_puff",(ulong)uVar2,"nodes");
      return uVar2;
    }
    for (local_4c = 0; local_4c < ref_cell_00->node_per; local_4c = local_4c + 1) {
      uVar2 = ref_node_add(ref_node,(long)prism[(long)local_4c + 0x1a],&i);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x87,"ref_layer_puff",(ulong)uVar2,"add");
        return uVar2;
      }
      for (local_148 = 0; local_148 < 3; local_148 = local_148 + 1) {
        ref_node->real[local_148 + i * 0xf] =
             ref_grid->node->real[local_148 + prism[(long)local_4c + 0x1a] * 0xf];
      }
    }
  }
  iVar1 = ref_node->n;
  ref_layer->nnode_per_layer = iVar1;
  for (nnode_per_layer = 0; nnode_per_layer < iVar1; nnode_per_layer = nnode_per_layer + 1) {
    uVar2 = ref_node_add(ref_node,(long)nnode_per_layer + ref_grid->node->old_n_global,&i);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",0x93,
             "ref_layer_puff",(ulong)uVar2,"add");
      return uVar2;
    }
    if (((nnode_per_layer < 0) || (ref_node->max <= nnode_per_layer)) ||
       (ref_node->global[nnode_per_layer] < 0)) {
      local_290 = -1;
    }
    else {
      local_290 = (REF_INT)ref_node->global[nnode_per_layer];
    }
    uVar2 = ref_layer_normal(ref_layer,ref_grid,local_290,(REF_DBL *)&ref_private_macro_code_rss_1);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",0x96,
             "ref_layer_puff",(ulong)uVar2,"normal");
      return uVar2;
    }
    for (local_148 = 0; local_148 < 3; local_148 = local_148 + 1) {
      ref_node->real[local_148 + i * 0xf] =
           *(double *)(&ref_private_macro_code_rss_1 + (long)local_148 * 2) * 0.1 +
           ref_node->real[local_148 + nnode_per_layer * 0xf];
    }
  }
  for (cell_node = 0; cell_node < ref_layer->ref_list->n; cell_node = cell_node + 1) {
    uVar2 = ref_cell_nodes(ref_cell_00,ref_layer->ref_list->value[cell_node],prism + 0x1a);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",0x9f,
             "ref_layer_puff",(ulong)uVar2,"nodes");
      return uVar2;
    }
    for (local_4c = 0; local_4c < ref_cell_00->node_per; local_4c = local_4c + 1) {
      uVar2 = ref_node_local(ref_node,(long)prism[(long)local_4c + 0x1a],&nnode_per_layer);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0xa1,"ref_layer_puff",(ulong)uVar2,"local");
        return uVar2;
      }
      (&node)[local_4c] = nnode_per_layer;
      (&node)[local_4c + 3] = nnode_per_layer + iVar1;
    }
    uVar2 = ref_cell_add(ref_cell_01,&node,&local);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",0xa5,
             "ref_layer_puff",(ulong)uVar2,"add");
      return uVar2;
    }
  }
  cell_node = 0;
  do {
    if (ref_layer->ref_list->n <= cell_node) {
      return 0;
    }
    cell_00 = ref_layer->ref_list->value[cell_node];
    uVar2 = ref_cell_nodes(ref_cell_00,cell_00,prism + 0x1a);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",0xab,
             "ref_layer_puff",(ulong)uVar2,"nodes");
      return uVar2;
    }
    for (local_50 = 0; local_50 < ref_cell_00->edge_per; local_50 = local_50 + 1) {
      node0_00 = prism[(long)ref_cell_00->e2n[local_50 << 1] + 0x1a];
      cell_list[1] = prism[(long)ref_cell_00->e2n[local_50 * 2 + 1] + 0x1a];
      uVar2 = ref_cell_list_with2(ref_cell_00,node0_00,cell_list[1],2,cell_list,&contains1);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0xb5,"ref_layer_puff",(ulong)uVar2,"find with 2");
        return uVar2;
      }
      if ((long)cell_list[0] != 2) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0xb6,"ref_layer_puff","expected two tri for tri side",2,(long)cell_list[0]);
        return 1;
      }
      uVar2 = ref_list_contains(ref_layer->ref_list,contains1,&local_1b0);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0xb9,"ref_layer_puff",(ulong)uVar2,"0 in layer");
        return uVar2;
      }
      uVar2 = ref_list_contains(ref_layer->ref_list,contains0,&local_1b4);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0xbc,"ref_layer_puff",(ulong)uVar2,"1 in layer");
        return uVar2;
      }
      if ((local_1b0 == 0) || (local_1b4 == 0)) {
        if ((local_1b0 == 0) && (local_1b4 == 0)) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
                 0xbe,"ref_layer_puff","tri side is not in layer");
          return 1;
        }
        uVar2 = ref_node_local(ref_node,(long)node0_00,&nnode_per_layer);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
                 0xbf,"ref_layer_puff",(ulong)uVar2,"local");
          return uVar2;
        }
        local_228 = nnode_per_layer + iVar1;
        uVar2 = ref_node_local(ref_node,(long)cell_list[1],&nnode_per_layer);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
                 0xc1,"ref_layer_puff",(ulong)uVar2,"local");
          return uVar2;
        }
        ref_private_macro_code_rss_8 = nnode_per_layer + iVar1;
        if (local_1b0 != 0) {
          if ((long)cell_00 != (long)contains1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                   ,0xc4,"ref_layer_puff","cell should be in layer",(long)cell_00,(long)contains1);
            return 1;
          }
          edge_nodes[0] = ref_cell_00->c2n[ref_cell_00->size_per * contains0 + 3];
        }
        if (local_1b4 != 0) {
          if ((long)cell_00 != (long)contains0) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                   ,200,"ref_layer_puff","cell should be in layer",(long)cell_00,(long)contains0);
            return 1;
          }
          edge_nodes[0] = ref_cell_00->c2n[ref_cell_00->size_per * contains1 + 3];
        }
        uVar2 = ref_cell_add(ref_cell_02,&local_228,&local);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
                 0xcb,"ref_layer_puff",(ulong)uVar2,"add");
          return uVar2;
        }
      }
    }
    cell_node = cell_node + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_layer_puff(REF_LAYER ref_layer, REF_GRID ref_grid) {
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_NODE layer_node = ref_grid_node(ref_layer_grid(ref_layer));
  REF_CELL layer_prism = ref_grid_pri(ref_layer_grid(ref_layer));
  REF_CELL layer_edge = ref_grid_edg(ref_layer_grid(ref_layer));
  REF_INT item, cell, cell_node, cell_edge, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT prism[REF_CELL_MAX_SIZE_PER];
  REF_INT new_cell;
  REF_INT node, local, i, nnode_per_layer;
  REF_GLOB global;
  REF_DBL norm[3];

  /* first layer of nodes */
  each_ref_list_item(ref_layer_list(ref_layer), item) {
    cell = ref_list_value(ref_layer_list(ref_layer), item);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      RSS(ref_node_add(layer_node, nodes[cell_node], &node), "add");
      for (i = 0; i < 3; i++)
        ref_node_xyz(layer_node, i, node) =
            ref_node_xyz(ref_grid_node(ref_grid), i, nodes[cell_node]);
    }
  }
  nnode_per_layer = ref_node_n(layer_node);
  ref_layer->nnode_per_layer = nnode_per_layer;

  /* second layer of nodes */
  for (local = 0; local < nnode_per_layer; local++) {
    global = (REF_GLOB)local + ref_node_n_global(ref_grid_node(ref_grid));
    RSS(ref_node_add(layer_node, global, &node), "add");
    RSS(ref_layer_normal(ref_layer, ref_grid,
                         (REF_INT)ref_node_global(layer_node, local), norm),
        "normal");
    for (i = 0; i < 3; i++)
      ref_node_xyz(layer_node, i, node) =
          0.1 * norm[i] + ref_node_xyz(layer_node, i, local);
  }

  /* layer of prisms */
  each_ref_list_item(ref_layer_list(ref_layer), item) {
    cell = ref_list_value(ref_layer_list(ref_layer), item);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      RSS(ref_node_local(layer_node, nodes[cell_node], &local), "local");
      prism[cell_node] = local;
      prism[3 + cell_node] = local + nnode_per_layer;
    }
    RSS(ref_cell_add(layer_prism, prism, &new_cell), "add");
  }

  /* constrain faces */
  each_ref_list_item(ref_layer_list(ref_layer), item) {
    cell = ref_list_value(ref_layer_list(ref_layer), item);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    each_ref_cell_cell_edge(ref_cell, cell_edge) {
      REF_INT node0;
      REF_INT node1;
      REF_INT ncell, cell_list[2];
      REF_BOOL contains0, contains1;
      REF_INT edge_nodes[REF_CELL_MAX_SIZE_PER];
      node0 = nodes[ref_cell_e2n_gen(ref_cell, 0, cell_edge)];
      node1 = nodes[ref_cell_e2n_gen(ref_cell, 1, cell_edge)];
      RSS(ref_cell_list_with2(ref_cell, node0, node1, 2, &ncell, cell_list),
          "find with 2");
      REIS(2, ncell, "expected two tri for tri side");
      RSS(ref_list_contains(ref_layer_list(ref_layer), cell_list[0],
                            &contains0),
          "0 in layer");
      RSS(ref_list_contains(ref_layer_list(ref_layer), cell_list[1],
                            &contains1),
          "1 in layer");
      if (contains0 && contains1) continue; /* tri side interior to layer */
      if (!contains0 && !contains1) THROW("tri side is not in layer");
      RSS(ref_node_local(layer_node, node0, &local), "local");
      edge_nodes[0] = local + nnode_per_layer;
      RSS(ref_node_local(layer_node, node1, &local), "local");
      edge_nodes[1] = local + nnode_per_layer;
      if (contains0) {
        REIS(cell, cell_list[0], "cell should be in layer");
        edge_nodes[2] = ref_cell_c2n(ref_cell, 3, cell_list[1]);
      }
      if (contains1) {
        REIS(cell, cell_list[1], "cell should be in layer");
        edge_nodes[2] = ref_cell_c2n(ref_cell, 3, cell_list[0]);
      }
      RSS(ref_cell_add(layer_edge, edge_nodes, &new_cell), "add");
    }
  }

  return REF_SUCCESS;
}